

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt slang::SVInt::fromDecimalDigits
                (bitwidth_t bits,bool isSigned,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  byte bVar1;
  undefined8 extraout_RDX;
  ulong uVar2;
  long lVar3;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  ulong in_R8;
  ulong uVar4;
  bool bVar5;
  SVInt SVar6;
  uint64_t word;
  uint64_t maxWord;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_70;
  anon_class_8_1_54a39804 nextDigit;
  uint32_t count;
  logic_t *d;
  anon_class_32_4_88832beb writeWord;
  
  this.val._4_4_ = in_register_0000003c;
  this.val._0_4_ = bits;
  allocZeroed((SVInt *)this.pVal,(bitwidth_t)CONCAT71(in_register_00000031,isSigned),
              digits._M_ptr._0_1_,false);
  nextDigit.d = &d;
  writeWord.count = &count;
  count = 0;
  writeWord.maxWord = &maxWord;
  maxWord = 1000000000000000000;
  writeWord.word = &word;
  local_70 = this;
  d = (logic_t *)digits._M_extent._M_extent_value._M_extent_value;
  writeWord.result = (SVInt *)this;
  for (uVar4 = 0x12; uVar4 < in_R8; uVar4 = uVar4 + 0x12) {
    bVar1 = fromDecimalDigits::anon_class_8_1_54a39804::operator()(&nextDigit);
    uVar2 = (ulong)bVar1;
    for (lVar3 = -0x11; word = uVar2, lVar3 != 0; lVar3 = lVar3 + 1) {
      bVar1 = fromDecimalDigits::anon_class_8_1_54a39804::operator()(&nextDigit);
      uVar2 = (ulong)bVar1 + uVar2 * 10;
    }
    fromDecimalDigits::anon_class_32_4_88832beb::operator()(&writeWord);
  }
  maxWord = 10;
  bVar1 = fromDecimalDigits::anon_class_8_1_54a39804::operator()(&nextDigit);
  uVar2 = (ulong)bVar1;
  lVar3 = (in_R8 - uVar4) + 0x11;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, word = uVar2, bVar5) {
    bVar1 = fromDecimalDigits::anon_class_8_1_54a39804::operator()(&nextDigit);
    uVar2 = (ulong)bVar1 + uVar2 * 10;
    maxWord = maxWord * 10;
  }
  fromDecimalDigits::anon_class_32_4_88832beb::operator()(&writeWord);
  SVar6.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar6.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar6.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar6.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar6.super_SVIntStorage.field_0.val = local_70.val;
  return (SVInt)SVar6.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDecimalDigits(bitwidth_t bits, bool isSigned, std::span<logic_t const> digits) {
    SVInt result = allocZeroed(bits, isSigned, false);

    constexpr int charsPerWord = 18; // 18 decimal digits can fit in a 64-bit word
    const logic_t* d = digits.data();
    uint64_t maxWord = (uint64_t)std::pow(10, charsPerWord);
    uint32_t count = 0;
    uint64_t word;

    auto nextDigit = [&]() {
        uint8_t v = d->value;
        if (v >= 10) {
            SLANG_THROW(
                std::invalid_argument(fmt::format("Digit {} too large for radix {}", v, 10)));
        }
        d++;
        return v;
    };

    auto writeWord = [&]() {
        if (!count) {
            if (word)
                result.pVal[count++] = word;
        }
        else {
            uint64_t carry = mulOne(result.pVal, result.pVal, count, maxWord);
            carry += addOne(result.pVal, result.pVal, count, word);
            if (carry)
                result.pVal[count++] = carry;
        }
    };

    size_t i;
    for (i = charsPerWord; i < digits.size(); i += charsPerWord) {
        word = nextDigit();
        for (size_t j = charsPerWord - 1; j != 0; j--)
            word = word * 10 + nextDigit();

        writeWord();
    }

    maxWord = 10;
    word = nextDigit();

    for (size_t j = digits.size() - (i - charsPerWord) - 1; j > 0; j--) {
        word = word * 10 + nextDigit();
        maxWord *= 10;
    }

    writeWord();

    return result;
}